

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O2

void __thiscall TCLAP::CmdLine::~CmdLine(CmdLine *this)

{
  (this->super_CmdLineInterface)._vptr_CmdLineInterface = (_func_int **)&PTR__CmdLine_001157f8;
  ClearContainer<std::__cxx11::list<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>
            (&this->_argDeleteOnExitList);
  ClearContainer<std::__cxx11::list<TCLAP::Visitor*,std::allocator<TCLAP::Visitor*>>>
            (&this->_visitorDeleteOnExitList);
  if (this->_userSetOutput == false) {
    if (this->_output != (CmdLineOutput *)0x0) {
      (*this->_output->_vptr_CmdLineOutput[1])();
    }
    this->_output = (CmdLineOutput *)0x0;
  }
  std::__cxx11::_List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::_M_clear
            (&(this->_visitorDeleteOnExitList).
              super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>);
  std::__cxx11::_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::_M_clear
            (&(this->_argDeleteOnExitList).
              super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&(this->_xorHandler)._orList);
  std::__cxx11::string::~string((string *)&this->_version);
  std::__cxx11::string::~string((string *)&this->_message);
  std::__cxx11::string::~string((string *)&this->_progName);
  std::__cxx11::_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::_M_clear
            (&(this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>);
  return;
}

Assistant:

inline CmdLine::~CmdLine()
{
	ClearContainer(_argDeleteOnExitList);
	ClearContainer(_visitorDeleteOnExitList);

	if ( !_userSetOutput ) {
		delete _output;
		_output = 0;
	}
}